

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompositeDeepScanLine.cpp
# Opt level: O0

void __thiscall Imf_3_4::CompositeDeepScanLine::Data::check_valid(Data *this,Header *header)

{
  bool bVar1;
  allocator<char> *__a;
  ArgExc *pAVar2;
  size_type sVar3;
  Header *this_00;
  Box2i *src;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  Header *match_header;
  string n;
  ConstIterator i;
  bool has_alpha;
  bool has_z;
  Box<Imath_3_2::Vec2<int>_> *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  Box<Imath_3_2::Vec2<int>_> *in_stack_ffffffffffffff68;
  Box<Imath_3_2::Vec2<int>_> *in_stack_ffffffffffffff70;
  allocator<char> *__s;
  DeepScanLineInputFile *in_stack_ffffffffffffffa0;
  allocator<char> local_49;
  string local_48 [32];
  const_iterator local_28;
  const_iterator local_20;
  byte local_12;
  byte local_11;
  
  local_11 = 0;
  local_12 = 0;
  Header::channels((Header *)0x17ed51);
  local_20._M_node = (_Base_ptr)ChannelList::begin((ChannelList *)in_stack_ffffffffffffff48);
  while( true ) {
    Header::channels((Header *)0x17ed6e);
    local_28._M_node = (_Base_ptr)ChannelList::end((ChannelList *)in_stack_ffffffffffffff48);
    bVar1 = Imf_3_4::operator!=((ConstIterator *)in_stack_ffffffffffffff50,
                                (ConstIterator *)in_stack_ffffffffffffff48);
    if (!bVar1) break;
    __a = (allocator<char> *)ChannelList::ConstIterator::name((ConstIterator *)0x17eda9);
    __s = &local_49;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(in_RDI,(char *)__s,__a);
    std::allocator<char>::~allocator(&local_49);
    bVar1 = std::operator==(in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48);
    if (bVar1) {
      in_RDI[3]._M_dataplus = (_Alloc_hider)0x1;
    }
    else {
      bVar1 = std::operator==(in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48);
      if (bVar1) {
        local_11 = 1;
      }
      else {
        bVar1 = std::operator==(in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48);
        if (bVar1) {
          local_12 = 1;
        }
      }
    }
    std::__cxx11::string::~string(local_48);
    ChannelList::ConstIterator::operator++((ConstIterator *)in_stack_ffffffffffffff50);
  }
  if ((local_11 & 1) != 0) {
    if ((local_12 & 1) == 0) {
      pAVar2 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::ArgExc::ArgExc
                (pAVar2,"Deep data provided to CompositeDeepScanLine is missing an alpha channel");
      __cxa_throw(pAVar2,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
    }
    sVar3 = std::
            vector<Imf_3_4::DeepScanLineInputPart_*,_std::allocator<Imf_3_4::DeepScanLineInputPart_*>_>
            ::size((vector<Imf_3_4::DeepScanLineInputPart_*,_std::allocator<Imf_3_4::DeepScanLineInputPart_*>_>
                    *)((long)&in_RDI->field_2 + 8));
    if ((sVar3 == 0) &&
       (sVar3 = std::
                vector<Imf_3_4::DeepScanLineInputFile_*,_std::allocator<Imf_3_4::DeepScanLineInputFile_*>_>
                ::size((vector<Imf_3_4::DeepScanLineInputFile_*,_std::allocator<Imf_3_4::DeepScanLineInputFile_*>_>
                        *)in_RDI), sVar3 == 0)) {
      Header::dataWindow((Header *)0x17efaf);
      Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator=
                ((Box<Imath_3_2::Vec2<int>_> *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    }
    else {
      sVar3 = std::
              vector<Imf_3_4::DeepScanLineInputPart_*,_std::allocator<Imf_3_4::DeepScanLineInputPart_*>_>
              ::size((vector<Imf_3_4::DeepScanLineInputPart_*,_std::allocator<Imf_3_4::DeepScanLineInputPart_*>_>
                      *)((long)&in_RDI->field_2 + 8));
      if (sVar3 == 0) {
        std::
        vector<Imf_3_4::DeepScanLineInputFile_*,_std::allocator<Imf_3_4::DeepScanLineInputFile_*>_>
        ::operator[]((vector<Imf_3_4::DeepScanLineInputFile_*,_std::allocator<Imf_3_4::DeepScanLineInputFile_*>_>
                      *)in_RDI,0);
        this_00 = DeepScanLineInputFile::header(in_stack_ffffffffffffffa0);
      }
      else {
        std::
        vector<Imf_3_4::DeepScanLineInputPart_*,_std::allocator<Imf_3_4::DeepScanLineInputPart_*>_>
        ::operator[]((vector<Imf_3_4::DeepScanLineInputPart_*,_std::allocator<Imf_3_4::DeepScanLineInputPart_*>_>
                      *)((long)&in_RDI->field_2 + 8),0);
        this_00 = DeepScanLineInputPart::header((DeepScanLineInputPart *)0x17eff6);
      }
      src = Header::displayWindow((Header *)0x17f02c);
      Header::displayWindow((Header *)0x17f03e);
      bVar1 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator!=
                        ((Box<Imath_3_2::Vec2<int>_> *)this_00,src);
      if (bVar1) {
        pAVar2 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc
                  (pAVar2,
                   "Deep data provided to CompositeDeepScanLine has a different displayWindow to previously provided data"
                  );
        __cxa_throw(pAVar2,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
      }
      Header::dataWindow((Header *)0x17f0c2);
      Imath_3_2::Box<Imath_3_2::Vec2<int>_>::extendBy
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    }
    return;
  }
  pAVar2 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc
            (pAVar2,"Deep data provided to CompositeDeepScanLine is missing a Z channel");
  __cxa_throw(pAVar2,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

void
CompositeDeepScanLine::Data::check_valid (const Header& header)
{

    bool has_z     = false;
    bool has_alpha = false;
    // check good channel names
    for (ChannelList::ConstIterator i = header.channels ().begin ();
         i != header.channels ().end ();
         ++i)
    {
        std::string n (i.name ());
        if (n == "ZBack") { _zback = true; }
        else if (n == "Z") { has_z = true; }
        else if (n == "A") { has_alpha = true; }
    }

    if (!has_z)
    {
        throw IEX_NAMESPACE::ArgExc (
            "Deep data provided to CompositeDeepScanLine is missing a Z channel");
    }

    if (!has_alpha)
    {
        throw IEX_NAMESPACE::ArgExc (
            "Deep data provided to CompositeDeepScanLine is missing an alpha channel");
    }

    if (_part.size () == 0 && _file.size () == 0)
    {
        // first in - update and return

        _dataWindow = header.dataWindow ();

        return;
    }

    const Header* const match_header = _part.size () > 0 ? &_part[0]->header ()
                                                         : &_file[0]->header ();

    // check the sizes match
    if (match_header->displayWindow () != header.displayWindow ())
    {
        throw IEX_NAMESPACE::ArgExc (
            "Deep data provided to CompositeDeepScanLine has a different displayWindow to previously provided data");
    }

    _dataWindow.extendBy (header.dataWindow ());
}